

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O0

merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
* __thiscall
burst::
make_merge_iterator<std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>&,std::greater<void>>
          (merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
           *__return_storage_ptr__,burst *this)

{
  iterator iVar1;
  iterator iVar2;
  vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
  *ranges_local;
  
  iVar1 = std::
          begin<std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>
                    ((vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
                      *)this);
  iVar2 = std::
          end<std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>
                    ((vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
                      *)this);
  make_merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,std::greater<void>>
            (__return_storage_ptr__,(burst *)iVar1._M_current,iVar2._M_current);
  return __return_storage_ptr__;
}

Assistant:

auto make_merge_iterator (RandomAccessRange && ranges, Compare compare)
    {
        using std::begin;
        using std::end;
        return
            make_merge_iterator
            (
                begin(std::forward<RandomAccessRange>(ranges)),
                end(std::forward<RandomAccessRange>(ranges)),
                compare
            );
    }